

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSortByPType.cpp
# Opt level: O1

void __thiscall SortByPTypeProcessTest::SetUp(SortByPTypeProcessTest *this)

{
  int *piVar1;
  uint uVar2;
  SortByPTypeProcessTest *pSVar3;
  bool bVar4;
  SortByPTypeProcess *this_00;
  aiScene *this_01;
  aiMesh **ppaVar5;
  aiMesh *paVar6;
  undefined8 *puVar7;
  aiVector3D *__s;
  aiVector3D *__s_00;
  aiVector3D *__s_01;
  aiVector3D *__s_02;
  aiVector3D *__s_03;
  uint *puVar8;
  long lVar9;
  aiNode *paVar10;
  aiNode **ppaVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  aiFace *paVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  uint remaining [4];
  undefined8 local_48;
  undefined8 uStack_40;
  SortByPTypeProcessTest *local_38;
  
  this_00 = (SortByPTypeProcess *)operator_new(0x20);
  Assimp::SortByPTypeProcess::SortByPTypeProcess(this_00);
  this->mProcess1 = this_00;
  this_01 = (aiScene *)operator_new(0x80);
  aiScene::aiScene(this_01);
  this->mScene = this_01;
  this_01->mNumMeshes = 10;
  ppaVar5 = (aiMesh **)operator_new__(0x50);
  this_01->mMeshes = ppaVar5;
  lVar16 = 0;
  bVar4 = false;
  local_38 = this;
  do {
    pSVar3 = local_38;
    paVar6 = (aiMesh *)operator_new(0x520);
    paVar6->mPrimitiveTypes = 0;
    paVar6->mNumVertices = 0;
    paVar6->mNumFaces = 0;
    memset(&paVar6->mVertices,0,0xcc);
    paVar6->mBones = (aiBone **)0x0;
    paVar6->mMaterialIndex = 0;
    (paVar6->mName).length = 0;
    (paVar6->mName).data[0] = '\0';
    memset((paVar6->mName).data + 1,0x1b,0x3ff);
    paVar6->mNumAnimMeshes = 0;
    paVar6->mAnimMeshes = (aiAnimMesh **)0x0;
    paVar6->mMethod = 0;
    (paVar6->mAABB).mMin.x = 0.0;
    (paVar6->mAABB).mMin.y = 0.0;
    (paVar6->mAABB).mMin.z = 0.0;
    (paVar6->mAABB).mMax.x = 0.0;
    (paVar6->mAABB).mMax.y = 0.0;
    (paVar6->mAABB).mMax.z = 0.0;
    paVar6->mTextureCoords[0] = (aiVector3D *)0x0;
    paVar6->mTextureCoords[1] = (aiVector3D *)0x0;
    paVar6->mTextureCoords[2] = (aiVector3D *)0x0;
    paVar6->mTextureCoords[3] = (aiVector3D *)0x0;
    paVar6->mTextureCoords[4] = (aiVector3D *)0x0;
    paVar6->mTextureCoords[5] = (aiVector3D *)0x0;
    paVar6->mTextureCoords[6] = (aiVector3D *)0x0;
    paVar6->mTextureCoords[7] = (aiVector3D *)0x0;
    paVar6->mNumUVComponents[0] = 0;
    paVar6->mNumUVComponents[1] = 0;
    paVar6->mNumUVComponents[2] = 0;
    paVar6->mNumUVComponents[3] = 0;
    paVar6->mNumUVComponents[4] = 0;
    paVar6->mNumUVComponents[5] = 0;
    paVar6->mNumUVComponents[6] = 0;
    paVar6->mNumUVComponents[7] = 0;
    paVar6->mColors[0] = (aiColor4D *)0x0;
    paVar6->mColors[1] = (aiColor4D *)0x0;
    paVar6->mColors[2] = (aiColor4D *)0x0;
    paVar6->mColors[3] = (aiColor4D *)0x0;
    paVar6->mColors[4] = (aiColor4D *)0x0;
    paVar6->mColors[5] = (aiColor4D *)0x0;
    paVar6->mColors[6] = (aiColor4D *)0x0;
    paVar6->mColors[7] = (aiColor4D *)0x0;
    pSVar3->mScene->mMeshes[lVar16] = paVar6;
    paVar6->mNumFaces = 1000;
    puVar7 = (undefined8 *)operator_new__(0x3e88);
    *puVar7 = 1000;
    lVar13 = 0x10;
    do {
      *(undefined4 *)((long)puVar7 + lVar13 + -8) = 0;
      *(undefined8 *)((long)puVar7 + lVar13) = 0;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x3e90);
    paVar15 = (aiFace *)(puVar7 + 1);
    paVar6->mFaces = paVar15;
    __s = (aiVector3D *)operator_new__(60000);
    memset(__s,0,60000);
    paVar6->mVertices = __s;
    uVar2 = paVar6->mNumFaces;
    uVar17 = (ulong)(uVar2 * 5);
    __s_00 = (aiVector3D *)operator_new__(uVar17 * 0xc);
    if (uVar2 != 0) {
      memset(__s_00,0,((uVar17 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar6->mNormals = __s_00;
    __s_01 = (aiVector3D *)operator_new__(uVar17 * 0xc);
    if (uVar2 != 0) {
      memset(__s_01,0,((uVar17 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar6->mTangents = __s_01;
    uVar2 = paVar6->mNumFaces;
    uVar17 = (ulong)(uVar2 * 5);
    __s_02 = (aiVector3D *)operator_new__(uVar17 * 0xc);
    if (uVar2 != 0) {
      memset(__s_02,0,((uVar17 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar6->mBitangents = __s_02;
    __s_03 = (aiVector3D *)operator_new__(uVar17 * 0xc);
    if (uVar2 != 0) {
      memset(__s_03,0,((uVar17 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar6->mTextureCoords[0] = __s_03;
    local_48 = *(undefined8 *)::num[lVar16];
    uStack_40 = *(undefined8 *)(::num[lVar16] + 2);
    uVar12 = 0;
    uVar2 = 0;
    do {
      uVar18 = uVar12 & 3;
      while (uVar17 = (ulong)uVar18, *(int *)((long)&local_48 + uVar17 * 4) == 0) {
        uVar18 = uVar18 + 1;
        if (uVar18 == 4) {
          uVar18 = 0;
        }
      }
      paVar15->mNumIndices = uVar18 + 1;
      if (uVar18 + 1 == 4) {
        if (bVar4) {
          paVar15->mNumIndices = 5;
        }
        bVar4 = (bool)(bVar4 ^ 1);
      }
      uVar18 = paVar15->mNumIndices;
      puVar8 = (uint *)operator_new__((ulong)uVar18 * 4);
      paVar15->mIndices = puVar8;
      if ((ulong)uVar18 != 0) {
        uVar14 = 0;
        lVar13 = 0;
        do {
          lVar9 = lVar13;
          paVar15->mIndices[uVar14] = uVar2 + (int)uVar14;
          fVar19 = (float)*(uint *)((long)&local_48 + uVar17 * 4);
          fVar20 = (float)(uVar14 & 0xffffffff) + fVar19;
          *(float *)((long)&__s->x + lVar9) = fVar19;
          *(float *)((long)&__s_00->x + lVar9) = fVar19;
          *(float *)((long)&__s_01->x + lVar9) = fVar19;
          *(float *)((long)&__s_02->x + lVar9) = fVar19;
          *(float *)((long)&__s_03->x + lVar9) = fVar19;
          fVar19 = fVar19 + 1.0;
          *(float *)((long)&__s->y + lVar9) = fVar19;
          *(float *)((long)&__s->z + lVar9) = fVar20;
          *(float *)((long)&__s_00->y + lVar9) = fVar19;
          *(float *)((long)&__s_00->z + lVar9) = fVar20;
          *(float *)((long)&__s_01->y + lVar9) = fVar19;
          *(float *)((long)&__s_01->z + lVar9) = fVar20;
          *(float *)((long)&__s_02->y + lVar9) = fVar19;
          *(float *)((long)&__s_02->z + lVar9) = fVar20;
          *(float *)((long)&__s_03->y + lVar9) = fVar19;
          *(float *)((long)&__s_03->z + lVar9) = fVar20;
          uVar14 = uVar14 + 1;
          lVar13 = lVar9 + 0xc;
        } while (uVar14 < paVar15->mNumIndices);
        uVar2 = uVar2 + (int)uVar14;
        __s_03 = (aiVector3D *)((long)&__s_03[1].x + lVar9);
        __s_02 = (aiVector3D *)((long)&__s_02[1].x + lVar9);
        __s_01 = (aiVector3D *)((long)&__s_01[1].x + lVar9);
        __s_00 = (aiVector3D *)((long)&__s_00[1].x + lVar9);
        __s = (aiVector3D *)((long)&__s[1].x + lVar9);
      }
      piVar1 = (int *)((long)&local_48 + uVar17 * 4);
      *piVar1 = *piVar1 + -1;
      pSVar3 = local_38;
      paVar15 = paVar15 + 1;
      uVar12 = uVar12 + 1;
    } while (uVar12 != 1000);
    paVar6->mNumVertices = uVar2;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 10);
  paVar10 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar10);
  pSVar3->mScene->mRootNode = paVar10;
  pSVar3->mScene->mRootNode->mNumChildren = 5;
  ppaVar11 = (aiNode **)operator_new__(0x28);
  pSVar3->mScene->mRootNode->mChildren = ppaVar11;
  lVar16 = 0;
  do {
    paVar10 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar10);
    *(aiNode **)((long)pSVar3->mScene->mRootNode->mChildren + lVar16 * 4) = paVar10;
    paVar10->mNumMeshes = 2;
    puVar8 = (uint *)operator_new__(8);
    paVar10->mMeshes = puVar8;
    *puVar8 = (uint)lVar16;
    puVar8[1] = (uint)lVar16 + 1;
    lVar16 = lVar16 + 2;
  } while (lVar16 != 10);
  return;
}

Assistant:

void SortByPTypeProcessTest::SetUp() {
    mProcess1 = new SortByPTypeProcess();
    mScene = new aiScene();

    mScene->mNumMeshes = 10;
    mScene->mMeshes = new aiMesh*[10];

    bool five = false;
    for (unsigned int i = 0; i < 10; ++i) {
        aiMesh* mesh = mScene->mMeshes[i] = new aiMesh();
        mesh->mNumFaces = 1000;
        aiFace* faces =  mesh->mFaces = new aiFace[1000];
        aiVector3D* pv = mesh->mVertices = new aiVector3D[mesh->mNumFaces*5];
        aiVector3D* pn = mesh->mNormals = new aiVector3D[mesh->mNumFaces*5];

        aiVector3D* pt = mesh->mTangents = new aiVector3D[mesh->mNumFaces*5];
        aiVector3D* pb = mesh->mBitangents = new aiVector3D[mesh->mNumFaces*5];

        aiVector3D* puv = mesh->mTextureCoords[0] = new aiVector3D[mesh->mNumFaces*5];

        unsigned int remaining[4] = {num[i][0],num[i][1],num[i][2],num[i][3]};
        unsigned int n = 0;
        for (unsigned int m = 0; m < 1000; ++m) {
            unsigned int idx = m % 4;
            while (true) {
                if (!remaining[idx]) {
                    if (4 == ++idx) {
                        idx = 0;
                    }
                    continue;
                }
                break;
            }
            faces->mNumIndices = idx+1;
            if (4 == faces->mNumIndices) {
                if(five)++faces->mNumIndices;
                five = !five;
            }
            faces->mIndices = new unsigned int[faces->mNumIndices];
            for (unsigned int q = 0; q <faces->mNumIndices;++q,++n) {
                faces->mIndices[q] = n;
                float f = (float)remaining[idx];

                // (the values need to be unique - otherwise all degenerates would be removed)
                *pv++ = aiVector3D(f,f+1.f,f+q);
                *pn++ = aiVector3D(f,f+1.f,f+q);
                *pt++ = aiVector3D(f,f+1.f,f+q);
                *pb++ = aiVector3D(f,f+1.f,f+q);
                *puv++ = aiVector3D(f,f+1.f,f+q);
            }
            ++faces;
            --remaining[idx];
        }
        mesh->mNumVertices = n;
    }

    mScene->mRootNode = new aiNode();
    mScene->mRootNode->mNumChildren = 5;
    mScene->mRootNode->mChildren = new aiNode*[5];
    for (unsigned int i = 0; i< 5;++i ) {
        aiNode* node = mScene->mRootNode->mChildren[i] = new aiNode();
        node->mNumMeshes = 2;
        node->mMeshes = new unsigned int[2];
        node->mMeshes[0] = (i<<1u);
        node->mMeshes[1] = (i<<1u)+1;
    }
}